

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_eckey_edge_case_test(void)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  void *pvVar2;
  secp256k1_context *psVar3;
  int iVar4;
  unsigned_long _zzq_result_26;
  unsigned_long _zzq_args_26 [6];
  unsigned_long _zzq_result_25;
  unsigned_long _zzq_args_25 [6];
  unsigned_long _zzq_result_24;
  unsigned_long _zzq_args_24 [6];
  unsigned_long _zzq_result_23;
  unsigned_long _zzq_args_23 [6];
  unsigned_long _zzq_result_22;
  unsigned_long _zzq_args_22 [6];
  unsigned_long _zzq_result_21;
  unsigned_long _zzq_args_21 [6];
  unsigned_long _zzq_result_20;
  unsigned_long _zzq_args_20 [6];
  unsigned_long _zzq_result_19;
  unsigned_long _zzq_args_19 [6];
  unsigned_long _zzq_result_18;
  unsigned_long _zzq_args_18 [6];
  secp256k1_callback _saved_callback_15;
  int32_t _calls_to_callback_15;
  unsigned_long _zzq_result_17;
  unsigned_long _zzq_args_17 [6];
  secp256k1_callback _saved_callback_14;
  int32_t _calls_to_callback_14;
  unsigned_long _zzq_result_16;
  unsigned_long _zzq_args_16 [6];
  secp256k1_callback _saved_callback_13;
  int32_t _calls_to_callback_13;
  unsigned_long _zzq_result_15;
  unsigned_long _zzq_args_15 [6];
  unsigned_long _zzq_result_14;
  unsigned_long _zzq_args_14 [6];
  unsigned_long _zzq_result_13;
  unsigned_long _zzq_args_13 [6];
  unsigned_long _zzq_result_12;
  unsigned_long _zzq_args_12 [6];
  secp256k1_callback _saved_callback_12;
  int32_t _calls_to_callback_12;
  secp256k1_callback _saved_callback_11;
  int32_t _calls_to_callback_11;
  secp256k1_callback _saved_callback_10;
  int32_t _calls_to_callback_10;
  secp256k1_callback _saved_callback_9;
  int32_t _calls_to_callback_9;
  secp256k1_callback _saved_callback_8;
  int32_t _calls_to_callback_8;
  secp256k1_callback _saved_callback_7;
  int32_t _calls_to_callback_7;
  secp256k1_callback _saved_callback_6;
  int32_t _calls_to_callback_6;
  secp256k1_callback _saved_callback_5;
  int32_t _calls_to_callback_5;
  secp256k1_callback _saved_callback_4;
  int32_t _calls_to_callback_4;
  secp256k1_callback _saved_callback_3;
  int32_t _calls_to_callback_3;
  secp256k1_callback _saved_callback_2;
  int32_t _calls_to_callback_2;
  secp256k1_callback _saved_callback_1;
  int32_t _calls_to_callback_1;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  unsigned_long _zzq_result_11;
  unsigned_long _zzq_args_11 [6];
  unsigned_long _zzq_result_10;
  unsigned_long _zzq_args_10 [6];
  unsigned_long _zzq_result_9;
  unsigned_long _zzq_args_9 [6];
  unsigned_long _zzq_result_8;
  unsigned_long _zzq_args_8 [6];
  unsigned_long _zzq_result_7;
  unsigned_long _zzq_args_7 [6];
  unsigned_long _zzq_result_6;
  unsigned_long _zzq_args_6 [6];
  unsigned_long _zzq_result_5;
  unsigned_long _zzq_args_5 [6];
  unsigned_long _zzq_result_4;
  unsigned_long _zzq_args_4 [6];
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_args_3 [6];
  unsigned_long _zzq_result_2;
  unsigned_long _zzq_args_2 [6];
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  size_t len;
  secp256k1_pubkey *pubkeys [3];
  secp256k1_pubkey pubkey_negone;
  secp256k1_pubkey pubkey_one;
  secp256k1_pubkey pubkey2;
  secp256k1_pubkey pubkey;
  uchar ctmp2 [33];
  uchar ctmp [33];
  uchar zeros [64];
  uchar orderc [32];
  _func_void_char_ptr_void_ptr *in_stack_fffffffffffff598;
  undefined6 in_stack_fffffffffffff5a0;
  undefined1 uVar5;
  undefined1 uVar6;
  uchar *in_stack_fffffffffffff5b8;
  uchar *in_stack_fffffffffffff5c0;
  secp256k1_context *in_stack_fffffffffffff5c8;
  uchar *in_stack_fffffffffffff5e8;
  uchar *in_stack_fffffffffffff5f0;
  secp256k1_context *in_stack_fffffffffffff5f8;
  uchar *in_stack_fffffffffffff608;
  secp256k1_pubkey *in_stack_fffffffffffff610;
  secp256k1_context *in_stack_fffffffffffff618;
  uchar *in_stack_fffffffffffff628;
  secp256k1_pubkey *in_stack_fffffffffffff630;
  secp256k1_context *in_stack_fffffffffffff638;
  undefined1 local_1c8 [64];
  undefined1 local_188 [64];
  undefined1 local_148 [64];
  undefined1 local_108 [64];
  undefined1 local_c8 [31];
  char local_a9;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_68 [64];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = 0xffffffffffffffff;
  local_20 = 0xfeffffffffffffff;
  local_18 = 0x3ba048afe6dcaeba;
  local_10 = 0x414136d08c5ed2bf;
  memset(local_68,0,0x40);
  iVar4 = secp256k1_ec_seckey_verify(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1791,"test condition failed: secp256k1_ec_seckey_verify(CTX, orderc) == 0");
    abort();
  }
  iVar4 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffff638,in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1793,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, orderc) == 0");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1795,
            "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
           );
    abort();
  }
  memset(&local_98,0xff,0x20);
  iVar4 = secp256k1_ec_seckey_verify(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1798,"test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 0");
    abort();
  }
  memset(local_108,1,0x40);
  iVar4 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffff638,in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x179b,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x179d,
            "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
           );
    abort();
  }
  memset(&local_98,0,0x20);
  iVar4 = secp256k1_ec_seckey_verify(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17a0,"test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 0");
    abort();
  }
  memset(local_108,1,0x40);
  iVar4 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffff638,in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17a3,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17a5,
            "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
           );
    abort();
  }
  local_80 = CONCAT17(1,(undefined7)local_80);
  iVar4 = secp256k1_ec_seckey_verify(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17a8,"test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 1");
    abort();
  }
  memset(local_108,0,0x40);
  iVar4 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffff638,in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17ab,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
  if (iVar4 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17ad,
            "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0"
           );
    abort();
  }
  memcpy(local_188,local_108,0x40);
  local_98 = local_28;
  local_90 = local_20;
  local_88 = local_18;
  local_80._0_7_ = (undefined7)local_10;
  local_80 = CONCAT17(0x42,(undefined7)local_80);
  iVar4 = secp256k1_ec_seckey_verify(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17b2,"test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 0");
    abort();
  }
  memset(local_108,1,0x40);
  iVar4 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffff638,in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17b5,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17b7,
            "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0"
           );
    abort();
  }
  local_80._7_1_ = '@';
  iVar4 = secp256k1_ec_seckey_verify(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17ba,"test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 1");
    abort();
  }
  memset(local_108,0,0x40);
  iVar4 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffff638,in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17bd,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
  if (iVar4 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17bf,
            "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0"
           );
    abort();
  }
  memcpy(local_1c8,local_108,0x40);
  memset(local_c8,0,0x20);
  iVar4 = secp256k1_ec_seckey_tweak_add
                    (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17c3,"test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 1");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(&local_28,&local_98,0x1f);
  uVar6 = iVar4 == 0 && local_80._7_1_ == '@';
  if (iVar4 != 0 || local_80._7_1_ != '@') {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17c4,
            "test condition failed: secp256k1_memcmp_var(orderc, ctmp, 31) == 0 && ctmp[31] == 0x40"
           );
    abort();
  }
  memcpy(local_148,local_108,0x40);
  iVar4 = secp256k1_ec_pubkey_tweak_add
                    (in_stack_fffffffffffff618,in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17c6,"test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1"
           );
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_108,local_148,0x40);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17c7,
            "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0");
    abort();
  }
  iVar4 = secp256k1_ec_seckey_tweak_mul
                    (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17c9,"test condition failed: secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_68,&local_98,0x20);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17ca,"test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0");
    abort();
  }
  iVar4 = secp256k1_ec_pubkey_tweak_mul
                    (in_stack_fffffffffffff638,in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17cb,"test condition failed: secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, ctmp2) == 0"
           );
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17cc,
            "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0");
    abort();
  }
  memcpy(local_108,local_148,0x40);
  local_98 = local_28;
  local_90 = local_20;
  local_88 = local_18;
  local_80 = local_10;
  memset(local_c8,0,0x20);
  local_a9 = 1;
  iVar4 = secp256k1_ec_seckey_verify(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17d3,"test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp2) == 1");
    abort();
  }
  iVar4 = secp256k1_ec_seckey_verify(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17d4,"test condition failed: secp256k1_ec_seckey_verify(CTX, ctmp) == 0");
    abort();
  }
  iVar4 = secp256k1_ec_seckey_tweak_add
                    (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17d5,"test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 0");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_68,&local_98,0x20);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17d6,"test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0");
    abort();
  }
  local_98 = local_28;
  local_90 = local_20;
  local_88 = local_18;
  local_80 = local_10;
  iVar4 = secp256k1_ec_seckey_tweak_mul
                    (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x17d8,"test condition failed: secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0");
    abort();
  }
  iVar4 = secp256k1_memcmp_var(local_68,&local_98,0x20);
  if (iVar4 == 0) {
    local_98 = local_28;
    local_90 = local_20;
    local_88 = local_18;
    local_80._0_7_ = (undefined7)local_10;
    local_80 = CONCAT17(0x40,(undefined7)local_80);
    iVar4 = secp256k1_ec_seckey_tweak_add
                      (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8
                      );
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17de,"test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp, orderc) == 0"
             );
      abort();
    }
    iVar4 = secp256k1_memcmp_var(local_68,&local_98,0x20);
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17df,"test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0");
      abort();
    }
    local_98 = local_28;
    local_90 = local_20;
    local_88 = local_18;
    local_80._0_7_ = (undefined7)local_10;
    local_80 = CONCAT17(0x40,(undefined7)local_80);
    iVar4 = secp256k1_ec_seckey_tweak_mul
                      (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8
                      );
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17e2,"test condition failed: secp256k1_ec_seckey_tweak_mul(CTX, ctmp, orderc) == 0"
             );
      abort();
    }
    iVar4 = secp256k1_memcmp_var(local_68,&local_98,0x20);
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17e3,"test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0");
      abort();
    }
    local_98 = local_28;
    local_90 = local_20;
    local_88 = local_18;
    local_80._0_7_ = (undefined7)local_10;
    local_80 = CONCAT17(0x40,(undefined7)local_80);
    iVar4 = secp256k1_ec_pubkey_tweak_add
                      (in_stack_fffffffffffff618,in_stack_fffffffffffff610,in_stack_fffffffffffff608
                      );
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17e8,
              "test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, orderc) == 0");
      abort();
    }
    iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17e9,
              "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0");
      abort();
    }
    memcpy(local_108,local_148,0x40);
    iVar4 = secp256k1_ec_pubkey_tweak_mul
                      (in_stack_fffffffffffff638,in_stack_fffffffffffff630,in_stack_fffffffffffff628
                      );
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17eb,
              "test condition failed: secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, orderc) == 0");
      abort();
    }
    iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17ec,
              "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0");
      abort();
    }
    memcpy(local_108,local_148,0x40);
    local_98 = local_28;
    local_90 = local_20;
    local_88 = local_18;
    local_80._0_7_ = (undefined7)local_10;
    local_80 = CONCAT17(0x40,(undefined7)local_80);
    memset(local_c8,0,0x20);
    local_a9 = 1;
    iVar4 = secp256k1_ec_seckey_tweak_add
                      (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8
                      );
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17f5,"test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 0")
      ;
      abort();
    }
    iVar4 = secp256k1_memcmp_var(local_68,local_c8,0x20);
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17f6,"test condition failed: secp256k1_memcmp_var(zeros, ctmp2, 32) == 0");
      abort();
    }
    local_a9 = 1;
    iVar4 = secp256k1_ec_pubkey_tweak_add
                      (in_stack_fffffffffffff618,in_stack_fffffffffffff610,in_stack_fffffffffffff608
                      );
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17f8,
              "test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 0");
      abort();
    }
    iVar4 = secp256k1_memcmp_var(local_108,local_68,0x40);
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17f9,
              "test condition failed: secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0");
      abort();
    }
    memcpy(local_108,local_148,0x40);
    local_a9 = '\x02';
    iVar4 = secp256k1_ec_seckey_tweak_add
                      (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8
                      );
    if (iVar4 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17fd,"test condition failed: secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 1")
      ;
      abort();
    }
    iVar4 = secp256k1_memcmp_var(local_c8,local_68,0x1f);
    uVar5 = iVar4 == 0 && local_a9 == '\x01';
    if (iVar4 != 0 || local_a9 != '\x01') {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x17fe,
              "test condition failed: secp256k1_memcmp_var(ctmp2, zeros, 31) == 0 && ctmp2[31] == 1"
             );
      abort();
    }
    local_a9 = 2;
    iVar4 = secp256k1_ec_pubkey_tweak_add
                      (in_stack_fffffffffffff618,in_stack_fffffffffffff610,in_stack_fffffffffffff608
                      );
    if (iVar4 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1800,
              "test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1");
      abort();
    }
    local_a9 = 1;
    iVar4 = secp256k1_ec_pubkey_create
                      (in_stack_fffffffffffff638,in_stack_fffffffffffff630,in_stack_fffffffffffff628
                      );
    if (iVar4 == 1) {
      iVar4 = secp256k1_memcmp_var(local_108,local_148,0x40);
      if (iVar4 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1803,
                "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0"
               );
        abort();
      }
      iVar4 = secp256k1_ec_pubkey_tweak_add
                        (in_stack_fffffffffffff618,in_stack_fffffffffffff610,
                         in_stack_fffffffffffff608);
      if (iVar4 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1805,
                "test condition failed: secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1");
        abort();
      }
      local_a9 = 2;
      iVar4 = secp256k1_ec_pubkey_tweak_mul
                        (in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                         in_stack_fffffffffffff628);
      if (iVar4 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1807,
                "test condition failed: secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey2, ctmp2) == 1");
        abort();
      }
      iVar4 = secp256k1_memcmp_var(local_108,local_148,0x40);
      if (iVar4 == 0) {
        memset(local_108,0,0x20);
        p_Var1 = (CTX->illegal_callback).fn;
        pvVar2 = (CTX->illegal_callback).data;
        secp256k1_context_set_illegal_callback
                  ((secp256k1_context *)CONCAT17(uVar6,CONCAT16(uVar5,in_stack_fffffffffffff5a0)),
                   in_stack_fffffffffffff598,(void *)0x11a600);
        iVar4 = secp256k1_ec_pubkey_tweak_add
                          (in_stack_fffffffffffff618,in_stack_fffffffffffff610,
                           in_stack_fffffffffffff608);
        psVar3 = CTX;
        if (iVar4 == 0) {
          (CTX->illegal_callback).fn = p_Var1;
          (psVar3->illegal_callback).data = pvVar2;
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
                  ,0x180b,"test condition failed: _calls_to_callback == 1");
          abort();
        }
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x180b,
                "test condition failed: (secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2)) == 0");
        abort();
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1808,
              "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0")
      ;
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1802,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey2, ctmp2) == 1");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x17d9,"test condition failed: secp256k1_memcmp_var(zeros, ctmp, 32) == 0");
  abort();
}

Assistant:

static void run_eckey_edge_case_test(void) {
    const unsigned char orderc[32] = {
        0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
        0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
        0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
        0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41
    };
    const unsigned char zeros[sizeof(secp256k1_pubkey)] = {0x00};
    unsigned char ctmp[33];
    unsigned char ctmp2[33];
    secp256k1_pubkey pubkey;
    secp256k1_pubkey pubkey2;
    secp256k1_pubkey pubkey_one;
    secp256k1_pubkey pubkey_negone;
    const secp256k1_pubkey *pubkeys[3];
    size_t len;
    /* Group order is too large, reject. */
    CHECK(secp256k1_ec_seckey_verify(CTX, orderc) == 0);
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, orderc) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* Maximum value is too large, reject. */
    memset(ctmp, 255, 32);
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    memset(&pubkey, 1, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* Zero is too small, reject. */
    memset(ctmp, 0, 32);
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    memset(&pubkey, 1, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* One must be accepted. */
    ctmp[31] = 0x01;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 1);
    memset(&pubkey, 0, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    pubkey_one = pubkey;
    /* Group order + 1 is too large, reject. */
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x42;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    memset(&pubkey, 1, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* -1 must be accepted. */
    ctmp[31] = 0x40;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 1);
    memset(&pubkey, 0, sizeof(pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, ctmp) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    pubkey_negone = pubkey;
    /* Tweak of zero leaves the value unchanged. */
    memset(ctmp2, 0, 32);
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(orderc, ctmp, 31) == 0 && ctmp[31] == 0x40);
    memcpy(&pubkey2, &pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    /* Multiply tweak of zero zeroizes the output. */
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    /* If seckey_tweak_add or seckey_tweak_mul are called with an overflowing
    seckey, the seckey is zeroized. */
    memcpy(ctmp, orderc, 32);
    memset(ctmp2, 0, 32);
    ctmp2[31] = 0x01;
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp2) == 1);
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 0);
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    memcpy(ctmp, orderc, 32);
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    /* If seckey_tweak_add or seckey_tweak_mul are called with an overflowing
    tweak, the seckey is zeroized. */
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp, orderc) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    CHECK(secp256k1_ec_seckey_tweak_mul(CTX, ctmp, orderc) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp, 32) == 0);
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    /* If pubkey_tweak_add or pubkey_tweak_mul are called with an overflowing
    tweak, the pubkey is zeroized. */
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, orderc) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, orderc) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    /* If the resulting key in secp256k1_ec_seckey_tweak_add and
     * secp256k1_ec_pubkey_tweak_add is 0 the functions fail and in the latter
     * case the pubkey is zeroized. */
    memcpy(ctmp, orderc, 32);
    ctmp[31] = 0x40;
    memset(ctmp2, 0, 32);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 0);
    CHECK(secp256k1_memcmp_var(zeros, ctmp2, 32) == 0);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 0);
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    /* Tweak computation wraps and results in a key of 1. */
    ctmp2[31] = 2;
    CHECK(secp256k1_ec_seckey_tweak_add(CTX, ctmp2, ctmp) == 1);
    CHECK(secp256k1_memcmp_var(ctmp2, zeros, 31) == 0 && ctmp2[31] == 1);
    ctmp2[31] = 2;
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1);
    ctmp2[31] = 1;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey2, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    /* Tweak mul * 2 = 1+1. */
    CHECK(secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2) == 1);
    ctmp2[31] = 2;
    CHECK(secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey2, ctmp2) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    /* Zeroize pubkey on parse error. */
    memset(&pubkey, 0, 32);
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, ctmp2));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(pubkey)) == 0);
    memcpy(&pubkey, &pubkey2, sizeof(pubkey));
    memset(&pubkey2, 0, 32);
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey2, ctmp2));
    CHECK(secp256k1_memcmp_var(&pubkey2, zeros, sizeof(pubkey2)) == 0);
    /* Plain argument errors. */
    CHECK(secp256k1_ec_seckey_verify(CTX, ctmp) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_verify(CTX, NULL));
    memset(ctmp2, 0, 32);
    ctmp2[31] = 4;
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_add(CTX, NULL, ctmp2));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, NULL));
    memset(ctmp2, 0, 32);
    ctmp2[31] = 4;
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_mul(CTX, NULL, ctmp2));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, NULL));
    memset(ctmp2, 0, 32);
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_tweak_add(CTX, NULL, ctmp2));
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_tweak_add(CTX, ctmp, NULL));
    memset(ctmp2, 0, 32);
    ctmp2[31] = 1;
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_tweak_mul(CTX, NULL, ctmp2));
    CHECK_ILLEGAL(CTX, secp256k1_ec_seckey_tweak_mul(CTX, ctmp, NULL));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, NULL, ctmp));
    memset(&pubkey, 1, sizeof(pubkey));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* secp256k1_ec_pubkey_combine tests. */
    pubkeys[0] = &pubkey_one;
    SECP256K1_CHECKMEM_UNDEFINE(&pubkeys[0], sizeof(secp256k1_pubkey *));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkeys[1], sizeof(secp256k1_pubkey *));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkeys[2], sizeof(secp256k1_pubkey *));
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 0));
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_combine(CTX, NULL, pubkeys, 1));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_combine(CTX, &pubkey, NULL, 1));
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    pubkeys[0] = &pubkey_negone;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 1) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    len = 33;
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp, &len, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp2, &len, &pubkey_negone, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_memcmp_var(ctmp, ctmp2, 33) == 0);
    /* Result is infinity. */
    pubkeys[0] = &pubkey_one;
    pubkeys[1] = &pubkey_negone;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 2) == 0);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) == 0);
    /* Passes through infinity but comes out one. */
    pubkeys[2] = &pubkey_one;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 3) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
    len = 33;
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp, &len, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_ec_pubkey_serialize(CTX, ctmp2, &len, &pubkey_one, SECP256K1_EC_COMPRESSED) == 1);
    CHECK(secp256k1_memcmp_var(ctmp, ctmp2, 33) == 0);
    /* Adds to two. */
    pubkeys[1] = &pubkey_one;
    memset(&pubkey, 255, sizeof(secp256k1_pubkey));
    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_ec_pubkey_combine(CTX, &pubkey, pubkeys, 2) == 1);
    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(secp256k1_pubkey));
    CHECK(secp256k1_memcmp_var(&pubkey, zeros, sizeof(secp256k1_pubkey)) > 0);
}